

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParser.hpp
# Opt level: O0

void __thiscall OpenMD::SectionParser::~SectionParser(SectionParser *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SectionParser_004e7b68;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

virtual ~SectionParser() = default;